

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

QTextList * __thiscall QTextCursor::createList(QTextCursor *this,QTextListFormat *format)

{
  long lVar1;
  bool bVar2;
  QTextCursorPrivate *pQVar3;
  undefined8 in_RSI;
  QTextFormat *in_RDI;
  long in_FS_OFFSET;
  QTextList *list;
  QTextBlockFormat modifier;
  QTextBlockFormat *in_stack_ffffffffffffffb8;
  int o;
  QTextFormat *this_00;
  undefined8 in_stack_ffffffffffffffe0;
  QTextObject *pQVar4;
  int objectIndex;
  QTextFormat *in_stack_ffffffffffffffe8;
  QTextDocumentPrivate *in_stack_fffffffffffffff0;
  
  o = (int)((ulong)in_RSI >> 0x20);
  objectIndex = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a5b6f);
  if (!bVar2) {
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)in_RDI);
    if (pQVar3->priv != (QTextDocumentPrivate *)0x0) {
      QSharedDataPointer<QTextCursorPrivate>::operator->
                ((QSharedDataPointer<QTextCursorPrivate> *)in_RDI);
      pQVar4 = QTextDocumentPrivate::createObject
                         (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,objectIndex);
      QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0x7a5bd3);
      QTextObject::objectIndex((QTextObject *)in_RDI);
      QTextFormat::setObjectIndex(this_00,o);
      mergeBlockFormat((QTextCursor *)in_RDI,in_stack_ffffffffffffffb8);
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7a5c0c);
      goto LAB_007a5c0c;
    }
  }
  pQVar4 = (QTextObject *)0x0;
LAB_007a5c0c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QTextList *)pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QTextList *QTextCursor::createList(const QTextListFormat &format)
{
    if (!d || !d->priv)
        return nullptr;

    QTextList *list = static_cast<QTextList *>(d->priv->createObject(format));
    QTextBlockFormat modifier;
    modifier.setObjectIndex(list->objectIndex());
    mergeBlockFormat(modifier);
    return list;
}